

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void stbi__tga_read_rgb16(stbi__context *s,stbi_uc *out)

{
  uint uVar1;
  
  uVar1 = stbi__get16le(s);
  *out = (stbi_uc)((ulong)((uVar1 >> 10 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
  out[1] = (stbi_uc)((ulong)((uVar1 >> 5 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
  out[2] = (stbi_uc)((ulong)((uVar1 & 0x1f) * 0xff) * 0x8421085 >> 0x20);
  return;
}

Assistant:

void stbi__tga_read_rgb16(stbi__context *s, stbi_uc* out)
{
   stbi__uint16 px = stbi__get16le(s);
   stbi__uint16 fiveBitMask = 31;
   // we have 3 channels with 5bits each
   int r = (px >> 10) & fiveBitMask;
   int g = (px >> 5) & fiveBitMask;
   int b = px & fiveBitMask;
   // Note that this saves the data in RGB(A) order, so it doesn't need to be swapped later
   out[0] = (r * 255)/31;
   out[1] = (g * 255)/31;
   out[2] = (b * 255)/31;

   // some people claim that the most significant bit might be used for alpha
   // (possibly if an alpha-bit is set in the "image descriptor byte")
   // but that only made 16bit test images completely translucent..
   // so let's treat all 15 and 16bit TGAs as RGB with no alpha.
}